

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::isStructBufferMethod(HlslParseContext *this,TString *name)

{
  bool bVar1;
  bool local_19;
  TString *name_local;
  HlslParseContext *this_local;
  
  bVar1 = std::operator==(name,"GetDimensions");
  local_19 = true;
  if (!bVar1) {
    bVar1 = std::operator==(name,"Load");
    local_19 = true;
    if (!bVar1) {
      bVar1 = std::operator==(name,"Load2");
      local_19 = true;
      if (!bVar1) {
        bVar1 = std::operator==(name,"Load3");
        local_19 = true;
        if (!bVar1) {
          bVar1 = std::operator==(name,"Load4");
          local_19 = true;
          if (!bVar1) {
            bVar1 = std::operator==(name,"Store");
            local_19 = true;
            if (!bVar1) {
              bVar1 = std::operator==(name,"Store2");
              local_19 = true;
              if (!bVar1) {
                bVar1 = std::operator==(name,"Store3");
                local_19 = true;
                if (!bVar1) {
                  bVar1 = std::operator==(name,"Store4");
                  local_19 = true;
                  if (!bVar1) {
                    bVar1 = std::operator==(name,"InterlockedAdd");
                    local_19 = true;
                    if (!bVar1) {
                      bVar1 = std::operator==(name,"InterlockedAnd");
                      local_19 = true;
                      if (!bVar1) {
                        bVar1 = std::operator==(name,"InterlockedCompareExchange");
                        local_19 = true;
                        if (!bVar1) {
                          bVar1 = std::operator==(name,"InterlockedCompareStore");
                          local_19 = true;
                          if (!bVar1) {
                            bVar1 = std::operator==(name,"InterlockedExchange");
                            local_19 = true;
                            if (!bVar1) {
                              bVar1 = std::operator==(name,"InterlockedMax");
                              local_19 = true;
                              if (!bVar1) {
                                bVar1 = std::operator==(name,"InterlockedMin");
                                local_19 = true;
                                if (!bVar1) {
                                  bVar1 = std::operator==(name,"InterlockedOr");
                                  local_19 = true;
                                  if (!bVar1) {
                                    bVar1 = std::operator==(name,"InterlockedXor");
                                    local_19 = true;
                                    if (!bVar1) {
                                      bVar1 = std::operator==(name,"IncrementCounter");
                                      local_19 = true;
                                      if (!bVar1) {
                                        bVar1 = std::operator==(name,"DecrementCounter");
                                        local_19 = true;
                                        if (!bVar1) {
                                          bVar1 = std::operator==(name,"Append");
                                          local_19 = true;
                                          if (!bVar1) {
                                            local_19 = std::operator==(name,"Consume");
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool HlslParseContext::isStructBufferMethod(const TString& name) const
{
    return
        name == "GetDimensions"              ||
        name == "Load"                       ||
        name == "Load2"                      ||
        name == "Load3"                      ||
        name == "Load4"                      ||
        name == "Store"                      ||
        name == "Store2"                     ||
        name == "Store3"                     ||
        name == "Store4"                     ||
        name == "InterlockedAdd"             ||
        name == "InterlockedAnd"             ||
        name == "InterlockedCompareExchange" ||
        name == "InterlockedCompareStore"    ||
        name == "InterlockedExchange"        ||
        name == "InterlockedMax"             ||
        name == "InterlockedMin"             ||
        name == "InterlockedOr"              ||
        name == "InterlockedXor"             ||
        name == "IncrementCounter"           ||
        name == "DecrementCounter"           ||
        name == "Append"                     ||
        name == "Consume";
}